

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O2

void __thiscall
slang::ast::Compilation::checkExternIfaceMethods
          (Compilation *this,
          span<const_slang::ast::MethodPrototypeSymbol_*const,_18446744073709551615UL> protos)

{
  long lVar1;
  Symbol *pSVar2;
  Diagnostic *pDVar3;
  char *pcVar4;
  long lVar5;
  bool bVar6;
  string_view arg;
  
  for (lVar5 = 0; protos._M_extent._M_extent_value._M_extent_value << 3 != lVar5; lVar5 = lVar5 + 8)
  {
    lVar1 = *(long *)((long)protos._M_ptr + lVar5);
    if ((*(long *)(lVar1 + 0xf8) == 0) && ((*(byte *)(lVar1 + 0xc1) & 8) == 0)) {
      pSVar2 = (*(Scope **)(lVar1 + 0x20))->thisSym;
      if (((pSVar2->name)._M_len != 0) && (*(long *)(lVar1 + 8) != 0)) {
        pDVar3 = Scope::addDiag(*(Scope **)(lVar1 + 0x20),(DiagCode)0x12000d,
                                *(SourceLocation *)(lVar1 + 0x18));
        bVar6 = *(int *)(lVar1 + 0xb8) == 0;
        pcVar4 = "task";
        if (bVar6) {
          pcVar4 = "function";
        }
        arg._M_str = pcVar4;
        arg._M_len = (ulong)bVar6 * 4 + 4;
        Diagnostic::operator<<(pDVar3,arg);
        pDVar3 = Diagnostic::operator<<(pDVar3,pSVar2->name);
        Diagnostic::operator<<(pDVar3,*(string_view *)(lVar1 + 8));
      }
    }
  }
  return;
}

Assistant:

void Compilation::checkExternIfaceMethods(std::span<const MethodPrototypeSymbol* const> protos) {
    for (auto proto : protos) {
        if (!proto->getFirstExternImpl() && !proto->flags.has(MethodFlags::ForkJoin)) {
            auto scope = proto->getParentScope();
            SLANG_ASSERT(scope);

            auto& parent = scope->asSymbol();
            if (!parent.name.empty() && !proto->name.empty()) {
                auto& diag = scope->addDiag(diag::MissingExternImpl, proto->location);
                diag << (proto->subroutineKind == SubroutineKind::Function ? "function"sv
                                                                           : "task"sv);
                diag << parent.name << proto->name;
            }
        }
    }
}